

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void __thiscall
kj::_::Deferred<kj::Function<void_()>_>::~Deferred(Deferred<kj::Function<void_()>_> *this)

{
  Iface *pIVar1;
  Disposer *pDVar2;
  
  run(this);
  if (((this->maybeFunc).ptr.isSet == true) &&
     (pIVar1 = (this->maybeFunc).ptr.field_1.value.impl.ptr, pIVar1 != (Iface *)0x0)) {
    (this->maybeFunc).ptr.field_1.value.impl.ptr = (Iface *)0x0;
    pDVar2 = (this->maybeFunc).ptr.field_1.value.impl.disposer;
    (**pDVar2->_vptr_Disposer)(pDVar2,pIVar1->_vptr_Iface[-2] + (long)&pIVar1->_vptr_Iface);
    return;
  }
  return;
}

Assistant:

~Deferred() noexcept(false) {
    run();
  }